

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O3

int affixMain(int argc,char **argv)

{
  char *name;
  char *name_00;
  int iVar1;
  err_t code;
  bool_t bVar2;
  u32 uVar3;
  size_t in_RAX;
  size_t sVar4;
  size_t sVar5;
  octet *prefix;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  long lVar9;
  size_t count;
  size_t local_38;
  
  local_38 = in_RAX;
  if (argc < 2) {
    pcVar8 = 
    "bee2cmd/%s: %s\nUsage:\n  affix prepend <file> <prefix>\n    prepend <prefix> to <file>\n  affix append <file> <suffix>\n    append <suffix> to <file>\n  affix behead <file>\n    delete prefix of <file>\n  affix drop <file>\n    delete suffix of <file>\n  affix extr {-p<n>|-s<n>} <file> <affix>\n    extract object from <file> and store it in <affix>\n      -p<nnn> -- <n>th prefix\n      -s<nnn> -- <n>th suffix\n      \\remark p0 goes first, s0 goes last\n  affix print [field] <file>\n    print <file> info: full info or a specific field\n      full info: lengths and total number of prefixes / suffixes\n      field: {-pc|-sc}\n        -pc -- number of prefixes\n        -sc -- number of suffixes\n"
    ;
    pcVar6 = "file prefixes and suffixes";
    goto LAB_001027ab;
  }
  iVar1 = strCmp(argv[1],"prepend");
  if (iVar1 == 0) {
    code = 0x25b;
    if (argc == 4) {
      code = cmdFileValExist(2,argv + 2);
      if ((code == 0) &&
         (code = cmdFilePrefixRead((octet *)0x0,&local_38,argv[3],0), sVar4 = local_38, code == 0))
      {
        sVar5 = cmdFileSize(argv[3]);
        code = 0x132;
        if (sVar4 == sVar5) {
          prefix = (octet *)blobCreate(local_38);
          if (prefix == (octet *)0x0) goto LAB_0010296c;
          code = cmdFilePrefixRead(prefix,&local_38,argv[3],0);
          if (code == 0) {
            code = cmdFilePrepend(argv[2],prefix,local_38);
          }
LAB_00102700:
          blobClose(prefix);
        }
      }
    }
LAB_0010278f:
    if (code == 0) {
      return 0;
    }
  }
  else {
    iVar1 = strCmp(argv[1],"append");
    if (iVar1 == 0) {
      code = 0x25b;
      if (argc == 4) {
        code = cmdFileValExist(2,argv + 2);
        if ((code == 0) &&
           (code = cmdFileSuffixRead((octet *)0x0,&local_38,argv[3],0), sVar4 = local_38, code == 0)
           ) {
          sVar5 = cmdFileSize(argv[3]);
          code = 0x132;
          if (sVar4 == sVar5) {
            prefix = (octet *)blobCreate(local_38);
            if (prefix == (octet *)0x0) goto LAB_0010296c;
            code = cmdFileSuffixRead(prefix,&local_38,argv[3],0);
            if (code == 0) {
              code = cmdFileAppend(argv[2],prefix,local_38);
            }
            goto LAB_00102700;
          }
        }
      }
      goto LAB_0010278f;
    }
    iVar1 = strCmp(argv[1],"behead");
    if (iVar1 == 0) {
      code = 0x25b;
      if (argc == 3) {
        ppcVar7 = argv + 2;
        code = cmdFileValExist(1,ppcVar7);
        if ((code == 0) && (code = cmdFilePrefixRead((octet *)0x0,&local_38,*ppcVar7,0), code == 0))
        {
          code = cmdFileBehead(*ppcVar7,local_38);
        }
      }
      goto LAB_0010278f;
    }
    iVar1 = strCmp(argv[1],"drop");
    if (iVar1 == 0) {
      code = 0x25b;
      if (argc == 3) {
        ppcVar7 = argv + 2;
        code = cmdFileValExist(1,ppcVar7);
        if ((code == 0) && (code = cmdFileSuffixRead((octet *)0x0,&local_38,*ppcVar7,0), code == 0))
        {
          code = cmdFileDrop(*ppcVar7,local_38);
        }
      }
      goto LAB_0010278f;
    }
    iVar1 = strCmp(argv[1],"extr");
    if (iVar1 == 0) {
      code = 0x25b;
      if (argc == 5) {
        pcVar6 = argv[2];
        sVar4 = strLen(pcVar6);
        if ((sVar4 != 0) && (*pcVar6 == '-')) {
          code = cmdFileValExist(1,argv + 3);
          if (code == 0) {
            code = cmdFileValNotExist(1,argv + 4);
            if (code == 0) {
              pcVar8 = pcVar6 + 1;
              name = argv[4];
              name_00 = argv[3];
              bVar2 = strStartsWith(pcVar8,"p");
              if ((bVar2 == 0) && (bVar2 = strStartsWith(pcVar8,"s"), bVar2 == 0)) {
                code = 0x25b;
              }
              else {
                pcVar6 = pcVar6 + 2;
                bVar2 = decIsValid(pcVar6);
                code = 0x25b;
                if (bVar2 != 0) {
                  sVar4 = strLen(pcVar6);
                  sVar5 = decCLZ(pcVar6);
                  if (sVar4 - sVar5 < 10) {
                    uVar3 = decToU32(pcVar6);
                    bVar2 = strStartsWith(pcVar8,"p");
                    local_38 = 0;
                    lVar9 = (ulong)uVar3 + 1;
                    sVar4 = 0;
                    if (bVar2 == 0) {
                      do {
                        sVar4 = sVar4 + local_38;
                        code = cmdFileSuffixRead((octet *)0x0,&local_38,name_00,sVar4);
                        if (code != 0) goto LAB_0010278f;
                        lVar9 = lVar9 + -1;
                      } while (lVar9 != 0);
                      prefix = (octet *)blobCreate(local_38);
                      if (prefix == (octet *)0x0) goto LAB_0010296c;
                      code = cmdFileSuffixRead(prefix,&local_38,name_00,sVar4);
                    }
                    else {
                      do {
                        sVar4 = sVar4 + local_38;
                        code = cmdFilePrefixRead((octet *)0x0,&local_38,name_00,sVar4);
                        if (code != 0) goto LAB_0010278f;
                        lVar9 = lVar9 + -1;
                      } while (lVar9 != 0);
                      prefix = (octet *)blobCreate(local_38);
                      if (prefix == (octet *)0x0) {
LAB_0010296c:
                        code = 0x6e;
                        goto LAB_0010278f;
                      }
                      code = cmdFilePrefixRead(prefix,&local_38,name_00,sVar4);
                    }
                    if (code == 0) {
                      code = cmdFileWrite(name,prefix,local_38);
                    }
                    goto LAB_00102700;
                  }
                }
              }
              goto LAB_0010278f;
            }
          }
        }
      }
    }
    else {
      iVar1 = strCmp(argv[1],"print");
      code = 0x259;
      if (iVar1 == 0) {
        code = affixPrint(argc + -2,argv + 2);
        goto LAB_0010278f;
      }
    }
  }
  pcVar6 = errMsg(code);
  pcVar8 = "bee2cmd/%s: %s\n";
LAB_001027ab:
  printf(pcVar8,"affix",pcVar6);
  return -1;
}

Assistant:

int affixMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return affixUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "prepend"))
		code = affixPrepend(argc - 1, argv + 1);
	else if (strEq(argv[0], "append"))
		code = affixAppend(argc - 1, argv + 1);
	else if (strEq(argv[0], "behead"))
		code = affixBehead(argc - 1, argv + 1);
	else if (strEq(argv[0], "drop"))
		code = affixDrop(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = affixExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = affixPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}